

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SquareMatrix.hpp
# Opt level: O0

void __thiscall
qclab::dense::SquareMatrix<float>::SquareMatrix
          (SquareMatrix<float> *this,float m00,float m01,float m10,float m11)

{
  type pfVar1;
  float m11_local;
  float m10_local;
  float m01_local;
  float m00_local;
  SquareMatrix<float> *this_local;
  
  this->size_ = 2;
  alloc_unique_array<float>((dense *)&this->data_,4);
  pfVar1 = std::unique_ptr<float[],_std::default_delete<float[]>_>::operator[](&this->data_,0);
  *pfVar1 = m00;
  pfVar1 = std::unique_ptr<float[],_std::default_delete<float[]>_>::operator[](&this->data_,1);
  *pfVar1 = m10;
  pfVar1 = std::unique_ptr<float[],_std::default_delete<float[]>_>::operator[](&this->data_,2);
  *pfVar1 = m01;
  pfVar1 = std::unique_ptr<float[],_std::default_delete<float[]>_>::operator[](&this->data_,3);
  *pfVar1 = m11;
  return;
}

Assistant:

SquareMatrix( const T m00 , const T m01 ,
                      const T m10 , const T m11 )
        : size_( 2 )
        , data_( alloc_unique_array< T >( 4 ) )
        {
          data_[0] = m00 ; data_[1] = m10 ;
          data_[2] = m01 ; data_[3] = m11 ;
        }